

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_4402ef::FoldExpr::printLeft(FoldExpr *this,OutputStream *S)

{
  Node *pNVar1;
  char *pcVar2;
  size_t sVar3;
  ParameterPackExpansion local_38;
  
  OutputStream::grow(S,1);
  sVar3 = S->CurrentPosition;
  S->CurrentPosition = sVar3 + 1;
  S->Buffer[sVar3] = '(';
  if (this->IsLeftFold == true) {
    pNVar1 = this->Init;
    if (pNVar1 != (Node *)0x0) {
      (*pNVar1->_vptr_Node[4])(pNVar1,S);
      if (pNVar1->RHSComponentCache != No) {
        (*pNVar1->_vptr_Node[5])(pNVar1,S);
      }
      OutputStream::grow(S,1);
      sVar3 = S->CurrentPosition;
      S->CurrentPosition = sVar3 + 1;
      S->Buffer[sVar3] = ' ';
      pcVar2 = (this->OperatorName).First;
      sVar3 = (long)(this->OperatorName).Last - (long)pcVar2;
      if (sVar3 != 0) {
        OutputStream::grow(S,sVar3);
        memmove(S->Buffer + S->CurrentPosition,pcVar2,sVar3);
        S->CurrentPosition = S->CurrentPosition + sVar3;
      }
      OutputStream::grow(S,1);
      sVar3 = S->CurrentPosition;
      S->CurrentPosition = sVar3 + 1;
      S->Buffer[sVar3] = ' ';
    }
    OutputStream::grow(S,4);
    builtin_strncpy(S->Buffer + S->CurrentPosition,"... ",4);
    S->CurrentPosition = S->CurrentPosition + 4;
    pcVar2 = (this->OperatorName).First;
    sVar3 = (long)(this->OperatorName).Last - (long)pcVar2;
    if (sVar3 != 0) {
      OutputStream::grow(S,sVar3);
      memmove(S->Buffer + S->CurrentPosition,pcVar2,sVar3);
      S->CurrentPosition = S->CurrentPosition + sVar3;
    }
    OutputStream::grow(S,1);
    sVar3 = S->CurrentPosition;
    S->CurrentPosition = sVar3 + 1;
    S->Buffer[sVar3] = ' ';
    OutputStream::grow(S,1);
    sVar3 = S->CurrentPosition;
    S->CurrentPosition = sVar3 + 1;
    S->Buffer[sVar3] = '(';
    local_38.Child = this->Pack;
    local_38.super_Node.K = KParameterPackExpansion;
    local_38.super_Node.RHSComponentCache = No;
    local_38.super_Node.ArrayCache = No;
    local_38.super_Node.FunctionCache = No;
    local_38.super_Node._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00202a98;
    ParameterPackExpansion::printLeft(&local_38,S);
    OutputStream::grow(S,1);
    sVar3 = S->CurrentPosition;
    S->CurrentPosition = sVar3 + 1;
    S->Buffer[sVar3] = ')';
  }
  else {
    OutputStream::grow(S,1);
    sVar3 = S->CurrentPosition;
    S->CurrentPosition = sVar3 + 1;
    S->Buffer[sVar3] = '(';
    local_38.Child = this->Pack;
    local_38.super_Node.K = KParameterPackExpansion;
    local_38.super_Node.RHSComponentCache = No;
    local_38.super_Node.ArrayCache = No;
    local_38.super_Node.FunctionCache = No;
    local_38.super_Node._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00202a98;
    ParameterPackExpansion::printLeft(&local_38,S);
    OutputStream::grow(S,1);
    sVar3 = S->CurrentPosition;
    S->CurrentPosition = sVar3 + 1;
    S->Buffer[sVar3] = ')';
    OutputStream::grow(S,1);
    sVar3 = S->CurrentPosition;
    S->CurrentPosition = sVar3 + 1;
    S->Buffer[sVar3] = ' ';
    pcVar2 = (this->OperatorName).First;
    sVar3 = (long)(this->OperatorName).Last - (long)pcVar2;
    if (sVar3 != 0) {
      OutputStream::grow(S,sVar3);
      memmove(S->Buffer + S->CurrentPosition,pcVar2,sVar3);
      S->CurrentPosition = S->CurrentPosition + sVar3;
    }
    OutputStream::grow(S,4);
    builtin_strncpy(S->Buffer + S->CurrentPosition," ...",4);
    S->CurrentPosition = S->CurrentPosition + 4;
    if (this->Init != (Node *)0x0) {
      OutputStream::grow(S,1);
      sVar3 = S->CurrentPosition;
      S->CurrentPosition = sVar3 + 1;
      S->Buffer[sVar3] = ' ';
      pcVar2 = (this->OperatorName).First;
      sVar3 = (long)(this->OperatorName).Last - (long)pcVar2;
      if (sVar3 != 0) {
        OutputStream::grow(S,sVar3);
        memmove(S->Buffer + S->CurrentPosition,pcVar2,sVar3);
        S->CurrentPosition = S->CurrentPosition + sVar3;
      }
      OutputStream::grow(S,1);
      sVar3 = S->CurrentPosition;
      S->CurrentPosition = sVar3 + 1;
      S->Buffer[sVar3] = ' ';
      pNVar1 = this->Init;
      (*pNVar1->_vptr_Node[4])(pNVar1,S);
      if (pNVar1->RHSComponentCache != No) {
        (*pNVar1->_vptr_Node[5])(pNVar1,S);
      }
    }
  }
  OutputStream::grow(S,1);
  sVar3 = S->CurrentPosition;
  S->CurrentPosition = sVar3 + 1;
  S->Buffer[sVar3] = ')';
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    auto PrintPack = [&] {
      S += '(';
      ParameterPackExpansion(Pack).print(S);
      S += ')';
    };

    S += '(';

    if (IsLeftFold) {
      // init op ... op pack
      if (Init != nullptr) {
        Init->print(S);
        S += ' ';
        S += OperatorName;
        S += ' ';
      }
      // ... op pack
      S += "... ";
      S += OperatorName;
      S += ' ';
      PrintPack();
    } else { // !IsLeftFold
      // pack op ...
      PrintPack();
      S += ' ';
      S += OperatorName;
      S += " ...";
      // pack op ... op init
      if (Init != nullptr) {
        S += ' ';
        S += OperatorName;
        S += ' ';
        Init->print(S);
      }
    }
    S += ')';
  }